

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O0

void Handlers::Character_Request(Player *player,PacketReader *reader)

{
  allocator local_79;
  string local_78;
  undefined1 local_48 [8];
  PacketBuilder reply;
  PacketReader *reader_local;
  Player *player_local;
  
  reply.add_size = (size_t)reader;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_CHARACTER,PACKET_REPLY,4);
  PacketBuilder::AddShort((PacketBuilder *)local_48,1000);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"OK",&local_79);
  PacketBuilder::AddString((PacketBuilder *)local_48,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Player::Send(player,(PacketBuilder *)local_48);
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Character_Request(Player *player, PacketReader &reader)
{
	(void)reader;

	PacketBuilder reply(PACKET_CHARACTER, PACKET_REPLY, 4);
	reply.AddShort(1000); // CreateID?
	reply.AddString("OK");

	player->Send(reply);
}